

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::ReadFileInitGlobal(duckdb *this,ClientContext *context,TableFunctionInitInput *input)

{
  unsigned_long uVar1;
  ReadFileGlobalState *in_RAX;
  FunctionData *pFVar2;
  pointer pRVar3;
  pointer puVar4;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ReadFileGlobalState_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  pFVar2 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&input->bind_data);
  make_uniq<duckdb::ReadFileGlobalState>();
  pRVar3 = unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
                         *)&local_28);
  ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::operator=
            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&pRVar3->files,
             (vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)(pFVar2 + 4));
  pRVar3 = unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
                         *)&local_28);
  LOCK();
  (pRVar3->current_file_idx).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  pRVar3 = unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
                         *)&local_28);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&(pRVar3->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
             &(input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  puVar4 = (input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (puVar4 == (input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish) goto LAB_015a69b7;
    uVar1 = *puVar4;
    puVar4 = puVar4 + 1;
  } while ((uVar1 == 0) || (uVar1 == 0xffffffffffffffff));
  pRVar3 = unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::ReadFileGlobalState,_std::default_delete<duckdb::ReadFileGlobalState>,_true>
                         *)&local_28);
  pRVar3->requires_file_open = true;
LAB_015a69b7:
  *(ReadFileGlobalState **)this = local_28._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )this;
}

Assistant:

static unique_ptr<GlobalTableFunctionState> ReadFileInitGlobal(ClientContext &context, TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<ReadFileBindData>();
	auto result = make_uniq<ReadFileGlobalState>();

	result->files = bind_data.files;
	result->current_file_idx = 0;
	result->column_ids = input.column_ids;

	for (const auto &column_id : input.column_ids) {
		// For everything except the 'file' name column, we need to open the file
		if (column_id != ReadFileBindData::FILE_NAME_COLUMN && column_id != COLUMN_IDENTIFIER_ROW_ID) {
			result->requires_file_open = true;
			break;
		}
	}

	return std::move(result);
}